

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfMultiPartInputFile.cpp
# Opt level: O0

void __thiscall Imf_2_5::MultiPartInputFile::Data::~Data(Data *this)

{
  size_type sVar1;
  reference ppIVar2;
  long in_RDI;
  size_t i;
  InputPartData *this_00;
  vector<Imf_2_5::Header,_std::allocator<Imf_2_5::Header>_> *in_stack_ffffffffffffffe0;
  ulong local_10;
  
  if (((*(byte *)(in_RDI + 0x3c) & 1) != 0) &&
     (in_stack_ffffffffffffffe0 =
           *(vector<Imf_2_5::Header,_std::allocator<Imf_2_5::Header>_> **)(in_RDI + 0x28),
     in_stack_ffffffffffffffe0 != (vector<Imf_2_5::Header,_std::allocator<Imf_2_5::Header>_> *)0x0))
  {
    (**(code **)&((_Rb_tree_header *)
                 ((long)&(((in_stack_ffffffffffffffe0->
                           super__Vector_base<Imf_2_5::Header,_std::allocator<Imf_2_5::Header>_>).
                           _M_impl.super__Vector_impl_data._M_start)->_map)._M_t._M_impl + 8))->
                 _M_header)();
  }
  for (local_10 = 0;
      sVar1 = std::vector<Imf_2_5::InputPartData_*,_std::allocator<Imf_2_5::InputPartData_*>_>::size
                        ((vector<Imf_2_5::InputPartData_*,_std::allocator<Imf_2_5::InputPartData_*>_>
                          *)(in_RDI + 0x40)), local_10 < sVar1; local_10 = local_10 + 1) {
    ppIVar2 = std::vector<Imf_2_5::InputPartData_*,_std::allocator<Imf_2_5::InputPartData_*>_>::
              operator[]((vector<Imf_2_5::InputPartData_*,_std::allocator<Imf_2_5::InputPartData_*>_>
                          *)(in_RDI + 0x40),local_10);
    this_00 = *ppIVar2;
    if (this_00 != (InputPartData *)0x0) {
      InputPartData::~InputPartData(this_00);
      operator_delete(this_00,0x70);
    }
  }
  std::vector<Imf_2_5::Header,_std::allocator<Imf_2_5::Header>_>::~vector(in_stack_ffffffffffffffe0)
  ;
  std::
  map<int,_Imf_2_5::GenericInputFile_*,_std::less<int>,_std::allocator<std::pair<const_int,_Imf_2_5::GenericInputFile_*>_>_>
  ::~map((map<int,_Imf_2_5::GenericInputFile_*,_std::less<int>,_std::allocator<std::pair<const_int,_Imf_2_5::GenericInputFile_*>_>_>
          *)0xabf353);
  std::vector<Imf_2_5::InputPartData_*,_std::allocator<Imf_2_5::InputPartData_*>_>::~vector
            ((vector<Imf_2_5::InputPartData_*,_std::allocator<Imf_2_5::InputPartData_*>_> *)
             in_stack_ffffffffffffffe0);
  return;
}

Assistant:

~Data()
    {
        if (deleteStream) delete is;

        for (size_t i = 0; i < parts.size(); i++)
            delete parts[i];
    }